

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O2

Id __thiscall spv::Builder::makeFunctionType(Builder *this,Id returnType,Vector<Id> *paramTypes)

{
  pointer puVar1;
  pointer ppIVar2;
  pointer puVar3;
  Id *pIVar4;
  Id IVar5;
  Instruction *this_00;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  int p;
  long lVar11;
  Instruction *local_40;
  _Head_base<0UL,_spv::Instruction_*,_false> local_38;
  
  ppIVar2 = this->groupedTypes[0x21].
            super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar6 = (ulong)((long)this->groupedTypes[0x21].
                        super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar2) >> 3;
  puVar3 = (paramTypes->
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar8 = (ulong)((long)(paramTypes->
                        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)puVar3) >> 2;
  uVar9 = 0;
  iVar7 = (int)uVar8;
  uVar10 = 0;
  if (0 < iVar7) {
    uVar10 = uVar8 & 0xffffffff;
  }
  uVar8 = uVar6 & 0xffffffff;
  if ((int)uVar6 < 1) {
    uVar8 = uVar9;
  }
  for (; uVar9 != uVar8; uVar9 = uVar9 + 1) {
    local_40 = ppIVar2[uVar9];
    pIVar4 = (local_40->operands).
             super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_start;
    if ((*pIVar4 == returnType) &&
       ((int)((ulong)((long)(local_40->operands).
                            super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar4) >> 2) + -1 ==
        iVar7)) {
      uVar6 = 0;
      do {
        if (uVar10 == uVar6) goto LAB_00197107;
        puVar1 = puVar3 + uVar6;
        lVar11 = uVar6 + 1;
        uVar6 = uVar6 + 1;
      } while (*puVar1 == pIVar4[lVar11]);
    }
  }
  this_00 = (Instruction *)dxil_spv::allocate_in_thread(0x38);
  IVar5 = this->uniqueId + 1;
  this->uniqueId = IVar5;
  this_00->_vptr_Instruction = (_func_int **)&PTR__Instruction_001e31e0;
  this_00->resultId = IVar5;
  this_00->typeId = 0;
  this_00->opCode = OpTypeFunction;
  (this_00->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00->block = (Block *)0x0;
  local_40 = this_00;
  Instruction::addIdOperand(this_00,returnType);
  for (lVar11 = 0;
      puVar3 = (paramTypes->
               super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>).
               _M_impl.super__Vector_impl_data._M_start,
      lVar11 < (int)((ulong)((long)(paramTypes->
                                   super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)puVar3) >> 2)
      ; lVar11 = lVar11 + 1) {
    Instruction::addIdOperand(this_00,puVar3[lVar11]);
  }
  std::vector<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>::push_back
            (this->groupedTypes + 0x21,&local_40);
  local_38._M_head_impl = local_40;
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)&this->constantsTypesGlobals,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_38);
  if (local_38._M_head_impl != (Instruction *)0x0) {
    (*(local_38._M_head_impl)->_vptr_Instruction[1])();
  }
  Module::mapInstruction(&this->module,local_40);
LAB_00197107:
  return local_40->resultId;
}

Assistant:

Id Builder::makeFunctionType(Id returnType, const dxil_spv::Vector<Id>& paramTypes)
{
    // try to find it
    Instruction* type;
    for (int t = 0; t < (int)groupedTypes[OpTypeFunction].size(); ++t) {
        type = groupedTypes[OpTypeFunction][t];
        if (type->getIdOperand(0) != returnType || (int)paramTypes.size() != type->getNumOperands() - 1)
            continue;
        bool mismatch = false;
        for (int p = 0; p < (int)paramTypes.size(); ++p) {
            if (paramTypes[p] != type->getIdOperand(p + 1)) {
                mismatch = true;
                break;
            }
        }
        if (! mismatch)
            return type->getResultId();
    }

    // not found, make it
    type = new Instruction(getUniqueId(), NoType, OpTypeFunction);
    type->addIdOperand(returnType);
    for (int p = 0; p < (int)paramTypes.size(); ++p)
        type->addIdOperand(paramTypes[p]);
    groupedTypes[OpTypeFunction].push_back(type);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(type));
    module.mapInstruction(type);

    return type->getResultId();
}